

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall cmStateDirectory::ComputeRelativePathTopSource(cmStateDirectory *this)

{
  pointer pcVar1;
  iterator iVar2;
  bool bVar3;
  PointerType pBVar4;
  cmStateSnapshot *this_00;
  cmStateSnapshot snapshot;
  string result;
  string currentSource;
  cmStateSnapshot *local_d8;
  iterator iStack_d0;
  cmStateSnapshot *local_c8;
  cmStateSnapshot local_b8;
  string local_a0;
  cmStateDirectory *local_80;
  string local_78;
  cmStateDirectory local_58;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8 = (cmStateSnapshot *)0x0;
  iStack_d0._M_current = (cmStateSnapshot *)0x0;
  local_c8 = (cmStateSnapshot *)0x0;
  local_80 = this;
  std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
  _M_realloc_insert<cmStateSnapshot_const&>
            ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,(iterator)0x0,
             &local_b8);
  do {
    while( true ) {
      cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_58,&local_b8);
      local_b8.Position.Position = (PositionType)local_58.Snapshot_.State;
      local_b8.State = (cmState *)local_58.DirectoryState.Tree;
      local_b8.Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_58.DirectoryState.Position;
      bVar3 = cmStateSnapshot::IsValid(&local_b8);
      if (!bVar3) {
        cmStateSnapshot::GetDirectory(&local_58,local_d8);
        pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&local_58.DirectoryState);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar1 = (pBVar4->Location)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar1,pcVar1 + (pBVar4->Location)._M_string_length);
        iVar2._M_current = iStack_d0._M_current;
        this_00 = local_d8 + 1;
        if (this_00 != iStack_d0._M_current) {
          do {
            cmStateSnapshot::GetDirectory(&local_58,this_00);
            pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&local_58.DirectoryState);
            pcVar1 = (pBVar4->Location)._M_dataplus._M_p;
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar1,pcVar1 + (pBVar4->Location)._M_string_length);
            bVar3 = cmsys::SystemTools::IsSubDirectory(&local_a0,&local_78);
            if (bVar3) {
              std::__cxx11::string::_M_assign((string *)&local_a0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            this_00 = this_00 + 1;
          } while (this_00 != iVar2._M_current);
        }
        pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&local_80->DirectoryState);
        std::__cxx11::string::_M_assign((string *)&pBVar4->RelativePathTopSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (cmStateSnapshot *)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        return;
      }
      if (iStack_d0._M_current != local_c8) break;
      std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
      _M_realloc_insert<cmStateSnapshot_const&>
                ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,iStack_d0,
                 &local_b8);
    }
    ((iStack_d0._M_current)->Position).Position = local_b8.Position.Position;
    *(undefined4 *)&(iStack_d0._M_current)->State = local_b8.State._0_4_;
    *(undefined4 *)((long)&(iStack_d0._M_current)->State + 4) = local_b8.State._4_4_;
    *(undefined4 *)&((iStack_d0._M_current)->Position).Tree = local_b8.Position.Tree._0_4_;
    *(undefined4 *)((long)&((iStack_d0._M_current)->Position).Tree + 4) =
         local_b8.Position.Tree._4_4_;
    iStack_d0._M_current = iStack_d0._M_current + 1;
  } while( true );
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentSource = snp.GetDirectory().GetCurrentSource();
    if (cmSystemTools::IsSubDirectory(result, currentSource)) {
      result = currentSource;
    }
  }
  this->DirectoryState->RelativePathTopSource = result;
}